

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tdm.cpp
# Opt level: O2

int __thiscall
CGameControllerTDM::OnCharacterDeath
          (CGameControllerTDM *this,CCharacter *pVictim,CPlayer *pKiller,int Weapon)

{
  int *piVar1;
  CPlayer *pCVar2;
  IServer *pIVar3;
  int iVar4;
  
  IGameController::OnCharacterDeath(&this->super_IGameController,pVictim,pKiller,Weapon);
  pCVar2 = pVictim->m_pPlayer;
  if (Weapon != -3 && pKiller != (CPlayer *)0x0) {
    if (pCVar2 == pKiller) {
      iVar4 = -1;
    }
    else {
      iVar4 = (uint)(pKiller->m_Team != pCVar2->m_Team) * 2 + -1;
    }
    piVar1 = (this->super_IGameController).m_aTeamscore + (pKiller->m_Team & 1);
    *piVar1 = *piVar1 + iVar4;
  }
  pIVar3 = (this->super_IGameController).m_pServer;
  iVar4 = ((this->super_IGameController).m_pConfig)->m_SvRespawnDelayTDM * pIVar3->m_TickSpeed +
          pIVar3->m_CurrentGameTick;
  if (iVar4 < pCVar2->m_RespawnTick) {
    iVar4 = pCVar2->m_RespawnTick;
  }
  pCVar2->m_RespawnTick = iVar4;
  return 0;
}

Assistant:

int CGameControllerTDM::OnCharacterDeath(class CCharacter *pVictim, class CPlayer *pKiller, int Weapon)
{
	IGameController::OnCharacterDeath(pVictim, pKiller, Weapon);


	if(pKiller && Weapon != WEAPON_GAME)
	{
		// do team scoring
		if(pKiller == pVictim->GetPlayer() || pKiller->GetTeam() == pVictim->GetPlayer()->GetTeam())
			m_aTeamscore[pKiller->GetTeam()&1]--; // klant arschel
		else
			m_aTeamscore[pKiller->GetTeam()&1]++; // good shit
	}

	pVictim->GetPlayer()->m_RespawnTick = maximum(pVictim->GetPlayer()->m_RespawnTick, Server()->Tick()+Server()->TickSpeed()*Config()->m_SvRespawnDelayTDM);

	return 0;
}